

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collation_binding.cpp
# Opt level: O3

bool duckdb::PushVarcharCollation
               (ClientContext *context,
               unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *source
               ,LogicalType *sql_type,CollationType type)

{
  _func_int **pp_Var1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  pointer pcVar3;
  size_type sVar4;
  optional_ptr<duckdb::Binder,_true> oVar5;
  undefined8 uVar6;
  int iVar7;
  const_iterator cVar8;
  reference pvVar9;
  BinderException *this;
  long lVar10;
  Catalog *pCVar11;
  byte bVar12;
  _func_int **pp_Var13;
  undefined8 *puVar14;
  undefined8 __k;
  byte bVar15;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  children;
  vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_true> entries;
  string collation;
  FunctionBinder function_binder;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  splits;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  collations;
  string str_collation;
  undefined1 local_2c8 [32];
  vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
  local_2a8;
  Catalog *local_288;
  FunctionBinder local_280;
  string local_270;
  ClientContext *local_250;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_248;
  undefined1 local_240 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  undefined1 local_210 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  float local_1f0;
  pointer local_1e8;
  undefined1 auStack_1e0 [16];
  pointer pLStack_1d0;
  atomic<unsigned_long> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string local_178;
  BaseScalarFunction local_158;
  _Any_data local_a8;
  pointer local_98;
  undefined8 local_88 [9];
  _Any_data local_40;
  
  bVar15 = 0;
  if (sql_type->id_ == VARCHAR) {
    local_248 = source;
    StringType::GetCollation_abi_cxx11_(&local_178,(StringType *)sql_type,sql_type);
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    local_270._M_string_length = 0;
    local_270.field_2._M_local_buf[0] = '\0';
    if ((_Hash_node_base *)local_178._M_string_length == (_Hash_node_base *)0x0) {
      DBConfig::GetConfig(context);
    }
    ::std::__cxx11::string::_M_assign((string *)&local_270);
    StringUtil::Lower((string *)local_210,&local_270);
    ::std::__cxx11::string::operator=((string *)&local_270,(string *)local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._0_8_ != &local_200) {
      operator_delete((void *)local_210._0_8_);
    }
    if ((((local_270._M_string_length == 0) ||
         (iVar7 = ::std::__cxx11::string::compare((char *)&local_270), iVar7 == 0)) ||
        (iVar7 = ::std::__cxx11::string::compare((char *)&local_270), iVar7 == 0)) ||
       (iVar7 = ::std::__cxx11::string::compare((char *)&local_270), iVar7 == 0)) {
      bVar12 = 0;
    }
    else {
      local_288 = Catalog::GetSystemCatalog(context);
      StringUtil::Lower((string *)local_210,&local_270);
      local_2c8._0_8_ = local_2c8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,".","");
      StringUtil::Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                         *)(local_240 + 0x18),(string *)local_210,(string *)local_2c8);
      if ((CollateCatalogEntry *)local_2c8._0_8_ != (CollateCatalogEntry *)(local_2c8 + 0x10)) {
        operator_delete((void *)local_2c8._0_8_);
      }
      local_280.context._4_4_ = type;
      local_250 = context;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._0_8_ != &local_200) {
        operator_delete((void *)local_210._0_8_);
      }
      local_2a8.
      super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2a8.
      super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2a8.
      super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (reference_wrapper<duckdb::CollateCatalogEntry> *)0x0;
      local_210._0_8_ = auStack_1e0;
      local_210._8_8_ = 1;
      local_200._M_allocated_capacity = 0;
      local_200._8_8_ = 0;
      local_1f0 = 1.0;
      local_1e8 = (pointer)0x0;
      auStack_1e0._0_8_ = 0;
      bVar12 = 1;
      __k = local_228._M_allocated_capacity;
      if (local_228._M_allocated_capacity != local_228._8_8_) {
        do {
          cVar8 = ::std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)local_210,(key_type *)__k);
          if (cVar8.
              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            local_2c8._0_8_ = local_2c8 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"main","");
            local_240._0_8_ =
                 Catalog::GetEntry<duckdb::CollateCatalogEntry>
                           (local_288,local_250,(string *)local_2c8,(string *)__k,THROW_EXCEPTION,
                            (QueryErrorContext)0xffffffffffffffff);
            optional_ptr<duckdb::CollateCatalogEntry,_true>::CheckValid
                      ((optional_ptr<duckdb::CollateCatalogEntry,_true> *)local_240);
            uVar6 = local_240._0_8_;
            if ((CollateCatalogEntry *)local_2c8._0_8_ != (CollateCatalogEntry *)(local_2c8 + 0x10))
            {
              operator_delete((void *)local_2c8._0_8_);
            }
            if (*(char *)&(((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(uVar6 + 0x238))->_M_h)._M_before_begin._M_nxt == '\x01') {
              local_2c8._0_8_ = uVar6;
              ::std::
              vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
              ::_M_insert_rval(&local_2a8,
                               (const_iterator)
                               local_2a8.
                               super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,(value_type *)local_2c8);
            }
            else {
              if ((local_2a8.
                   super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                   ._M_impl.super__Vector_impl_data._M_start !=
                   local_2a8.
                   super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) &&
                 (pvVar9 = vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_true>::back
                                     ((vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_true>
                                       *)&local_2a8), pvVar9->_M_data->combinable != true)) {
                this = (BinderException *)__cxa_allocate_exception(0x10);
                local_2c8._0_8_ = local_2c8 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_2c8,"Cannot combine collation types \"%s\" and \"%s\"",""
                          );
                pvVar9 = vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_true>::back
                                   ((vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_true>
                                     *)&local_2a8);
                local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
                pcVar3 = (pvVar9->_M_data->super_StandardEntry).super_InCatalogEntry.
                         super_CatalogEntry.name._M_dataplus._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_198,pcVar3,
                           pcVar3 + (pvVar9->_M_data->super_StandardEntry).super_InCatalogEntry.
                                    super_CatalogEntry.name._M_string_length);
                local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
                sVar4 = (((case_insensitive_map_t<reference<CommonTableExpressionInfo>_> *)
                         (uVar6 + 0x18))->_M_h)._M_bucket_count;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1b8,sVar4,
                           (long)&((((case_insensitive_map_t<reference<CommonTableExpressionInfo>_>
                                      *)(uVar6 + 0x18))->_M_h)._M_before_begin._M_nxt)->_M_nxt +
                           sVar4);
                BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                          (this,(string *)local_2c8,&local_198,&local_1b8);
                __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
              }
              local_2c8._0_8_ = uVar6;
              if (local_2a8.
                  super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_2a8.
                  super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                ::std::
                vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>>>
                ::_M_realloc_insert<std::reference_wrapper<duckdb::CollateCatalogEntry>>
                          ((vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>>>
                            *)&local_2a8,
                           (iterator)
                           local_2a8.
                           super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (reference_wrapper<duckdb::CollateCatalogEntry> *)local_2c8);
              }
              else {
                (local_2a8.
                 super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->_M_data = (CollateCatalogEntry *)uVar6
                ;
                local_2a8.
                super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_2a8.
                     super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            local_2c8._0_8_ = (CollateCatalogEntry *)local_210;
            ::std::
            _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                      ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)local_210,__k,local_2c8);
          }
          __k = __k + 0x20;
        } while (__k != local_228._8_8_);
        local_288 = (Catalog *)
                    local_2a8.
                    super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        if (local_2a8.
            super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_2a8.
            super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_240._16_8_ = &PTR__BaseScalarFunction_02433130;
          pCVar11 = (Catalog *)
                    local_2a8.
                    super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            pp_Var1 = pCVar11->_vptr_Catalog;
            bVar12 = local_280.context._4_4_ != COMBINABLE_COLLATIONS | *(byte *)(pp_Var1 + 0x49);
            if (bVar12 != 1) break;
            local_2c8._0_8_ = (CollateCatalogEntry *)0x0;
            local_2c8._8_8_ = (pointer)0x0;
            local_2c8._16_8_ = 0;
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                        *)local_2c8,local_248);
            FunctionBinder::FunctionBinder((FunctionBinder *)local_240,local_250);
            SimpleFunction::SimpleFunction
                      (&local_158.super_SimpleFunction,(SimpleFunction *)(pp_Var1 + 0x24));
            local_158.super_SimpleFunction.super_Function._vptr_Function =
                 (_func_int **)local_240._16_8_;
            LogicalType::LogicalType(&local_158.return_type,(LogicalType *)(pp_Var1 + 0x36));
            local_158._168_4_ = *(undefined4 *)(pp_Var1 + 0x39);
            local_158.super_SimpleFunction.super_Function._vptr_Function =
                 (_func_int **)&PTR__ScalarFunction_02432a00;
            ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
            ::function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                        *)&local_a8,
                       (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                        *)(pp_Var1 + 0x3a));
            pp_Var13 = pp_Var1 + 0x3e;
            puVar14 = local_88;
            for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
              *puVar14 = *pp_Var13;
              pp_Var13 = pp_Var13 + (ulong)bVar15 * -2 + 1;
              puVar14 = puVar14 + (ulong)bVar15 * -2 + 1;
            }
            local_40._M_unused._M_object = pp_Var1[0x47];
            local_40._8_8_ = pp_Var1[0x48];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_)->_M_use_count
                     + 1;
                UNLOCK();
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_)->_M_use_count
                     + 1;
              }
            }
            auStack_1e0._8_8_ = local_2c8._0_8_;
            pLStack_1d0 = (pointer)local_2c8._8_8_;
            local_1c8.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_2c8._16_8_;
            local_2c8._0_8_ = (CollateCatalogEntry *)0x0;
            local_2c8._8_8_ = 0;
            local_2c8._16_8_ = 0;
            FunctionBinder::BindScalarFunction
                      (&local_280,(ScalarFunction *)local_240,
                       (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                        *)&local_158,
                       SUB81((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                              *)(auStack_1e0 + 8),0),(optional_ptr<duckdb::Binder,_true>)0x0);
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       *)(auStack_1e0 + 8));
            local_158.super_SimpleFunction.super_Function._vptr_Function =
                 (_func_int **)&PTR__ScalarFunction_02432a00;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_);
            }
            if (local_98 != (pointer)0x0) {
              (*(code *)local_98)(&local_a8,&local_a8,__destroy_functor);
            }
            BaseScalarFunction::~BaseScalarFunction(&local_158);
            oVar5.ptr = local_280.binder.ptr;
            local_280.binder.ptr = (Binder *)0x0;
            _Var2._M_head_impl =
                 *(Expression **)
                  &(local_248->
                   super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
                   _M_t.
                   super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
            ;
            (local_248->
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 = (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   )oVar5.ptr;
            if (((_Head_base<0UL,_duckdb::Expression_*,_false>)_Var2._M_head_impl !=
                 (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) &&
               ((**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))(),
               local_280.binder.ptr != (Binder *)0x0)) {
              (*((BaseExpression *)
                &(local_280.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>)->
                _vptr_BaseExpression[1])();
            }
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       *)local_2c8);
            pCVar11 = (Catalog *)&pCVar11->db;
          } while (pCVar11 != local_288);
        }
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)local_210);
      if ((Catalog *)
          local_2a8.
          super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (Catalog *)0x0) {
        operator_delete(local_2a8.
                        super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_240 + 0x18));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
  }
  else {
    bVar12 = 0;
  }
  return (bool)bVar12;
}

Assistant:

bool PushVarcharCollation(ClientContext &context, unique_ptr<Expression> &source, const LogicalType &sql_type,
                          CollationType type) {
	if (sql_type.id() != LogicalTypeId::VARCHAR) {
		// only VARCHAR columns require collation
		return false;
	}
	// replace default collation with system collation
	auto str_collation = StringType::GetCollation(sql_type);
	string collation;
	if (str_collation.empty()) {
		collation = DBConfig::GetConfig(context).options.collation;
	} else {
		collation = str_collation;
	}
	collation = StringUtil::Lower(collation);
	// bind the collation
	if (collation.empty() || collation == "binary" || collation == "c" || collation == "posix") {
		// no collation or binary collation: skip
		return false;
	}
	auto &catalog = Catalog::GetSystemCatalog(context);
	auto splits = StringUtil::Split(StringUtil::Lower(collation), ".");
	vector<reference<CollateCatalogEntry>> entries;
	unordered_set<string> collations;
	for (auto &collation_argument : splits) {
		if (collations.count(collation_argument)) {
			// we already applied this collation
			continue;
		}
		auto &collation_entry = catalog.GetEntry<CollateCatalogEntry>(context, DEFAULT_SCHEMA, collation_argument);
		if (collation_entry.combinable) {
			entries.insert(entries.begin(), collation_entry);
		} else {
			if (!entries.empty() && !entries.back().get().combinable) {
				throw BinderException("Cannot combine collation types \"%s\" and \"%s\"", entries.back().get().name,
				                      collation_entry.name);
			}
			entries.push_back(collation_entry);
		}
		collations.insert(collation_argument);
	}
	for (auto &entry : entries) {
		auto &collation_entry = entry.get();
		if (!collation_entry.combinable && type == CollationType::COMBINABLE_COLLATIONS) {
			// not a combinable collation - ignore
			return false;
		}
		vector<unique_ptr<Expression>> children;
		children.push_back(std::move(source));

		FunctionBinder function_binder(context);
		auto function = function_binder.BindScalarFunction(collation_entry.function, std::move(children));
		source = std::move(function);
	}
	return true;
}